

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void return_val_ntrukeypair(strbuf *out,NTRUKeyPair *v)

{
  Value *pVVar1;
  Value *val;
  NTRUKeyPair *v_local;
  strbuf *out_local;
  
  pVVar1 = value_new(VT_ntrukeypair);
  (pVVar1->field_2).vu_ntrukeypair = v;
  BinarySink_put_datapl(out->binarysink_,pVVar1->id);
  BinarySink_put_byte(out->binarysink_,'\n');
  return;
}

Assistant:

static ptrlen get_word(BinarySource *in)
{
    ptrlen toret;
    toret.ptr = get_ptr(in);
    toret.len = 0;
    while (get_avail(in) && get_byte(in) != ' ')
        toret.len++;
    return toret;
}